

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::SetInput(Codec *this,void *message_in)

{
  Codec *in_RSI;
  long in_RDI;
  
  FreeInput(in_RSI);
  *(Codec **)(in_RDI + 0x30) = in_RSI;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void Codec::SetInput(const void * GF256_RESTRICT message_in)
{
    FreeInput();

    // Set input blocks to the input message
    _input_blocks = (uint8_t*)message_in;
    _input_allocated = 0;
}